

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodes.c
# Opt level: O0

void lsr_5E(void)

{
  byte bVar1;
  byte bVar2;
  
  except = '\0';
  bVar1 = getbyte(pc);
  bVar2 = getbyte(pc + 1);
  tempint = (ushort)bVar1 + (ushort)bVar2 * 0x100 + (ushort)x_reg;
  bVar1 = getbyte(tempint);
  carry_f = bVar1 & 1;
  result_f = (ubyte)((int)(uint)bVar1 >> 1);
  putbyte(result_f,tempint);
  pc = pc + 2;
  return;
}

Assistant:

void lsr_5E(void) {
    CLE;
    result_f = getbyte(tempint = getbyte(pc) + 0x100 * getbyte(pc + 1) + x_reg);
    carry_f = result_f & 1;
    result_f >>= 1;
    putbyte(result_f, tempint);
    pc += 2;
}